

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

void __thiscall Mat::Mat(Mat *this,int m,int n,double *a)

{
  double dVar1;
  double *pdVar2;
  ulong uVar3;
  uint uVar4;
  
  this->n_rows_ = m;
  this->n_cols_ = n;
  uVar4 = n * m;
  if ((int)uVar4 < 1) {
    pdVar2 = (double *)0x0;
  }
  else {
    pdVar2 = (double *)operator_new__((ulong)uVar4 * 8);
  }
  this->v_ = pdVar2;
  if (0 < (int)uVar4) {
    dVar1 = *a;
    uVar3 = 0;
    do {
      pdVar2[uVar3] = dVar1;
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  return;
}

Assistant:

Mat::Mat(int m, int n, const double& a) : n_rows_(m), n_cols_(n),v_(m*n>0 ? new double[m*n] : NULL)
{
	for(int i=0; i<m*n; i++) v_[i] = a;
}